

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddLinkLibrary(cmMakefile *this,string *lib,cmTargetLinkLibraryType llt)

{
  LibraryID tmp;
  value_type local_38;
  
  local_38.first._M_dataplus._M_p = (pointer)&local_38.first.field_2;
  local_38.first._M_string_length = 0;
  local_38.first.field_2._M_local_buf[0] = '\0';
  local_38.second = GENERAL_LibraryType;
  std::__cxx11::string::_M_assign((string *)&local_38);
  local_38.second = llt;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::push_back(&this->LinkLibraries,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::AddLinkLibrary(const std::string& lib,
                                cmTargetLinkLibraryType llt)
{
  cmTarget::LibraryID tmp;
  tmp.first = lib;
  tmp.second = llt;
  this->LinkLibraries.push_back(tmp);
}